

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void ClearMetadata(VP8LMetadata *hdr)

{
  WebPSafeFree((void *)0x146a02);
  VP8LHuffmanTablesDeallocate((HuffmanTables *)hdr);
  VP8LHtreeGroupsFree((HTreeGroup *)0x146a1c);
  VP8LColorCacheClear((VP8LColorCache *)0x146a29);
  VP8LColorCacheClear((VP8LColorCache *)0x146a36);
  InitMetadata((VP8LMetadata *)0x146a3f);
  return;
}

Assistant:

static void ClearMetadata(VP8LMetadata* const hdr) {
  assert(hdr != NULL);

  WebPSafeFree(hdr->huffman_image);
  VP8LHuffmanTablesDeallocate(&hdr->huffman_tables);
  VP8LHtreeGroupsFree(hdr->htree_groups);
  VP8LColorCacheClear(&hdr->color_cache);
  VP8LColorCacheClear(&hdr->saved_color_cache);
  InitMetadata(hdr);
}